

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

RangeListSyntax * __thiscall slang::parsing::Parser::parseRangeList(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  RangeListSyntax *pRVar6;
  Info *extraout_RDX;
  Info *src;
  size_t extraout_RDX_00;
  BumpAllocator *dst;
  ulong uVar7;
  TokenKind TVar8;
  Token current;
  Token TVar9;
  Token local_210;
  Token local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f0;
  undefined1 local_1e0;
  Token openBrace;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_1c8 [7];
  pointer pTVar5;
  
  Token::Token(&openBrace);
  Token::Token(&local_210);
  openBrace = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((openBrace._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&openBrace);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
    pTVar5 = (pointer)0x0;
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    goto LAB_0035d527;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  current = ParserBase::peek(&this->super_ParserBase);
  local_200 = current;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(current.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_200);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,SVar3);
    }
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_0035d4f6:
    src = local_210.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(current.kind);
    if (bVar1) {
      while( true ) {
        pEVar4 = parseValueRangeElement
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
        local_1f0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
        local_1e0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8);
        if (TVar8 == EndOfFile || bVar1) break;
        if (TVar8 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x580005,false);
            if (!bVar1) {
              local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_0035d4f6;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_1f0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1e0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8);
        if (TVar8 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((current.info == TVar9.info && current.kind == TVar8) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x580005,true), !bVar1)) break;
        uVar7 = TVar9._0_8_ & 0xffffffff;
        current.info = TVar9.info;
        current.kind = (short)uVar7;
        current._2_1_ = (char)(uVar7 >> 0x10);
        current.numFlags.raw = (char)(uVar7 >> 0x18);
        current.rawLen = (int)(uVar7 >> 0x20);
        local_200 = TVar9;
      }
      local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
      goto LAB_0035d4f6;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,current,CloseBrace,&local_210,(DiagCode)0x580005);
    src = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)src);
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_0035d527:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005a31e8;
  local_1c8[0].elements._M_ptr = pTVar5;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pRVar6 = slang::syntax::SyntaxFactory::rangeList(&this->factory,openBrace,local_1c8,local_210);
  return pRVar6;
}

Assistant:

RangeListSyntax& Parser::parseRangeList() {
    Token openBrace;
    Token closeBrace;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleValueRangeElement, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, list, closeBrace,
        RequireItems::True, diag::ExpectedValueRangeElement,
        [this] { return &parseValueRangeElement(); });

    return factory.rangeList(openBrace, list, closeBrace);
}